

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O0

void pstore::serialize::
     serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::read<pstore::serialize::archive::database_reader>(database_reader *archive,value_type *str)

{
  size_t count;
  char *ptr;
  span<char,__1L> uninit_span;
  char *data;
  size_t length;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
  deleter;
  anon_class_1_0_00000001_for__M_head_impl dtor;
  value_type *str_local;
  database_reader *archive_local;
  
  std::__cxx11::string::string((string *)str);
  std::
  unique_ptr<std::__cxx11::string,pstore::serialize::serializer<std::__cxx11::string,void>::read<pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&,std::__cxx11::string&)::{lambda(std::__cxx11::string*)#1}>
  ::
  unique_ptr<pstore::serialize::serializer<std::__cxx11::string,void>::read<pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&,std::__cxx11::string&)::_lambda(std::__cxx11::string*)_1_,void>
            ((unique_ptr<std::__cxx11::string,pstore::serialize::serializer<std::__cxx11::string,void>::read<pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&,std::__cxx11::string&)::_lambda(std::__cxx11::string*)_1_>
              *)&length,str,
             (deleter_type *)
             ((long)&deleter._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  count = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  std::__cxx11::string::resize((ulong)str);
  ptr = (char *)std::__cxx11::string::data();
  uninit_span = gsl::make_span<char>(ptr,count);
  read_uninit<pstore::serialize::archive::database_reader&,char,_1l>(archive,uninit_span);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp:121:29)>
  ::release((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
             *)&length);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp:121:29)>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
                 *)&length);
  return;
}

Assistant:

static void read (Archive && archive, value_type & str) {
                // Read the body of the string.
                new (&str) value_type;

                // Deleter will ensure that the string is destroyed on exit if an exception is
                // raised here.
                auto dtor = [] (value_type * const p) {
                    using string = std::string;
                    p->~string ();
                };
                std::unique_ptr<value_type, decltype (dtor)> deleter (&str, dtor);

                auto const length = string_helper::read_length (archive);
                str.resize (length);

#ifdef PSTORE_HAVE_NON_CONST_STD_STRING_DATA
                char * const data = str.data ();
#else
                // TODO: this is technically undefined behaviour. Remove once we've got access to
                // the C++17 library on our platforms.
                auto * const data = const_cast<char *> (str.data ());
#endif
                // Now read the body of the string.
                serialize::read_uninit (
                    archive, gsl::make_span (data, static_cast<std::ptrdiff_t> (length)));

                // Release ownership from the deleter so that the initialized object is returned to
                // the caller.
                deleter.release ();
            }